

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

bool __thiscall
TPathFragmentTable::CompareAndCopyPathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  TGenericArray<char> *this_00;
  TStruct40 *pTVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  
  pTVar1 = pSearch->pStruct40;
  this_00 = &pTVar1->PathBuffer;
  if ((this->PathMarks).TotalItemCount == 0) {
    while ((ulong)pTVar1->PathLength < pSearch->cchSearchMask) {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      bVar4 = *pcVar3 == pSearch->szSearchMask[pTVar1->PathLength];
      if (!bVar4) {
        return bVar4;
      }
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      TGenericArray<char>::Insert(this_00,*pcVar3);
      pTVar1->PathLength = pTVar1->PathLength + 1;
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset + 1);
      nFragmentOffset = nFragmentOffset + 1;
      if (*pcVar3 == '\0') {
        return bVar4;
      }
    }
    while (pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset),
          *pcVar3 != '\0') {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      TGenericArray<char>::Insert(this_00,*pcVar3);
      nFragmentOffset = nFragmentOffset + 1;
    }
  }
  else {
    while (nFragmentOffset < pSearch->cchSearchMask) {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      bVar4 = *pcVar3 == pSearch->szSearchMask[pTVar1->PathLength];
      if (!bVar4) {
        return bVar4;
      }
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      TGenericArray<char>::Insert(this_00,*pcVar3);
      pTVar1->PathLength = pTVar1->PathLength + 1;
      bVar2 = TSparseArray::IsItemPresent(&this->PathMarks,nFragmentOffset);
      nFragmentOffset = nFragmentOffset + 1;
      if (bVar2) {
        return bVar4;
      }
    }
    while (bVar4 = TSparseArray::IsItemPresent(&this->PathMarks,nFragmentOffset), !bVar4) {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      TGenericArray<char>::Insert(this_00,*pcVar3);
      nFragmentOffset = nFragmentOffset + 1;
    }
  }
  return true;
}

Assistant:

bool CompareAndCopyPathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if(PathMarks.IsEmpty())
        {
            // Keep copying as long as we don't reach the end of the search mask
            while(pStruct40->PathLength < pSearch->cchSearchMask)
            {
                // HOTS: 195A5A0
                if(PathFragments[nFragmentOffset] != pSearch->szSearchMask[pStruct40->PathLength])
                    return false;

                // HOTS: 195A5B7
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
                pStruct40->PathLength++;

                // If we found the end of the fragment, return success
                if(PathFragments[nFragmentOffset] == 0)
                    return true;
            }

            // HOTS: 195A660
            // Now we need to copy the rest of the fragment
            while(PathFragments[nFragmentOffset] != 0)
            {
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset]);
                nFragmentOffset++;
            }
        }
        else
        {
            // Keep copying as long as we don't reach the end of the search mask
            while(nFragmentOffset < pSearch->cchSearchMask)
            {
                if(PathFragments[nFragmentOffset] != pSearch->szSearchMask[pStruct40->PathLength])
                    return false;

                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset]);
                pStruct40->PathLength++;

                // If we found the end of the fragment, return success
                if(PathMarks.IsItemPresent(nFragmentOffset++))
                    return true;
            }

            // Now we need to copy the rest of the fragment
            while(!PathMarks.IsItemPresent(nFragmentOffset))
            {
                // HOTS: 195A7A6
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }

        return true;
    }